

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

void on_close(intptr_t uuid,fio_protocol_s *_ws)

{
  fio_protocol_s *_ws_local;
  intptr_t uuid_local;
  
  destroy_ws((ws_s *)_ws);
  return;
}

Assistant:

static void on_close(intptr_t uuid, fio_protocol_s *_ws) {
  destroy_ws((ws_s *)_ws);
  (void)uuid;
}